

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void helper_msa_cle_u_h_mips64el(CPUMIPSState_conflict10 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  fpr_t *pfVar1;
  undefined1 auVar2 [16];
  
  auVar2 = psubusw((undefined1  [16])(env->active_fpu).fpr[ws],
                   (undefined1  [16])(env->active_fpu).fpr[wt]);
  pfVar1 = (env->active_fpu).fpr + wd;
  *(ushort *)pfVar1 = -(ushort)(auVar2._0_2_ == 0);
  *(ushort *)((long)pfVar1 + 2) = -(ushort)(auVar2._2_2_ == 0);
  *(ushort *)((long)pfVar1 + 4) = -(ushort)(auVar2._4_2_ == 0);
  *(ushort *)((long)pfVar1 + 6) = -(ushort)(auVar2._6_2_ == 0);
  *(ushort *)((long)pfVar1 + 8) = -(ushort)(auVar2._8_2_ == 0);
  *(ushort *)((long)pfVar1 + 10) = -(ushort)(auVar2._10_2_ == 0);
  *(ushort *)((long)pfVar1 + 0xc) = -(ushort)(auVar2._12_2_ == 0);
  *(ushort *)((long)pfVar1 + 0xe) = -(ushort)(auVar2._14_2_ == 0);
  return;
}

Assistant:

void helper_msa_cle_u_h(CPUMIPSState *env,
                        uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->h[0]  = msa_cle_u_df(DF_HALF, pws->h[0],  pwt->h[0]);
    pwd->h[1]  = msa_cle_u_df(DF_HALF, pws->h[1],  pwt->h[1]);
    pwd->h[2]  = msa_cle_u_df(DF_HALF, pws->h[2],  pwt->h[2]);
    pwd->h[3]  = msa_cle_u_df(DF_HALF, pws->h[3],  pwt->h[3]);
    pwd->h[4]  = msa_cle_u_df(DF_HALF, pws->h[4],  pwt->h[4]);
    pwd->h[5]  = msa_cle_u_df(DF_HALF, pws->h[5],  pwt->h[5]);
    pwd->h[6]  = msa_cle_u_df(DF_HALF, pws->h[6],  pwt->h[6]);
    pwd->h[7]  = msa_cle_u_df(DF_HALF, pws->h[7],  pwt->h[7]);
}